

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O0

bool __thiscall
soul::HTMLGenerator::replaceTemplatePlaceholder
          (HTMLGenerator *this,CompileMessageList *errors,string *templateCode,string *placeholder,
          string *replacement)

{
  string_view firstReplacement;
  bool bVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  string_view firstToReplace;
  string *this_00;
  char *in_stack_fffffffffffffef0;
  CompileMessageList *this_01;
  string local_d8 [32];
  string local_b8;
  CodeLocation local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string_view local_58;
  string_view local_48;
  string *local_38;
  string *replacement_local;
  string *placeholder_local;
  string *templateCode_local;
  CompileMessageList *errors_local;
  HTMLGenerator *this_local;
  
  local_38 = replacement;
  replacement_local = placeholder;
  placeholder_local = templateCode;
  templateCode_local = (string *)errors;
  errors_local = (CompileMessageList *)this;
  local_48 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)templateCode);
  local_58 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)replacement_local);
  bVar1 = choc::text::contains(local_48,local_58);
  if (bVar1) {
    this_00 = local_d8;
    std::__cxx11::string::string(this_00,(string *)placeholder_local);
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)replacement_local);
    pcVar2 = (char *)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    firstReplacement._M_str = in_stack_fffffffffffffef0;
    firstReplacement._M_len = (size_t)this_00;
    firstToReplace._M_str = pcVar2;
    firstToReplace._M_len = auVar3._8_8_;
    choc::text::replace<std::__cxx11::string>
              (&local_b8,(text *)this_00,auVar3._0_8_,firstToReplace,firstReplacement);
    std::__cxx11::string::operator=((string *)placeholder_local,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string(local_d8);
  }
  else {
    this_01 = (CompileMessageList *)templateCode_local;
    std::operator+(&local_78,"Template doesn\'t contain placeholder ",replacement_local);
    local_88.sourceCode.object = (SourceCodeText *)0x0;
    local_88.location.data = (char *)0x0;
    CodeLocation::CodeLocation(&local_88);
    CompileMessageList::addError(this_01,&local_78,&local_88);
    CodeLocation::~CodeLocation(&local_88);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return bVar1;
}

Assistant:

bool replaceTemplatePlaceholder (soul::CompileMessageList& errors,
                                     std::string& templateCode,
                                     const std::string& placeholder,
                                     const std::string& replacement)
    {
        if (! choc::text::contains (templateCode, placeholder))
        {
            errors.addError ("Template doesn't contain placeholder " + placeholder, {});
            return false;
        }

        templateCode = choc::text::replace (templateCode, placeholder, replacement);
        return true;
    }